

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gate.cpp
# Opt level: O3

void __thiscall tiles::Gate::alternativeTile(Gate *this,Chunk *chunk,uint tileIndex)

{
  TileData TVar1;
  
  Chunk::markTileDirty(chunk,tileIndex);
  TVar1 = chunk->tiles_[tileIndex];
  if (((uint)TVar1 & 0x1f) != 9) {
    if (((uint)TVar1 & 1) == 0) {
      TVar1 = (TileData)((uint)TVar1 | 1);
    }
    else {
      TVar1 = (TileData)((uint)TVar1 & 0xffffffe0 | (int)TVar1 - 1U & 0x1e);
    }
    chunk->tiles_[tileIndex] = TVar1;
  }
  return;
}

Assistant:

void Gate::alternativeTile(Chunk& chunk, unsigned int tileIndex) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    if (tileData.id != TileId::gateDiode) {
        if ((tileData.id - TileId::gateBuffer) % 2 == 0) {
            tileData.id = static_cast<TileId::t>(tileData.id + 1);
        } else {
            tileData.id = static_cast<TileId::t>(tileData.id - 1);
        }
    }
}